

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall pstore::broker::command_processor::scavenge(command_processor *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  __it;
  double __x;
  not_null<const_char_*> local_d8;
  array<char,_100UL> buffer;
  tm local_68;
  
  local_d8.ptr_ = "Scavenging zombie commands";
  gsl::not_null<const_char_*>::ensure_invariant(&local_d8);
  pstore::log((pstore *)0x6,__x);
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar1 = (this->delete_threshold_).__r;
  std::mutex::lock(&this->cmds_mut_);
  __it._M_cur = (__node_type *)(this->cmds_)._M_h._M_before_begin._M_nxt;
  while (__it._M_cur != (__node_type *)0x0) {
    lVar2 = *(long *)((long)&((__it._M_cur)->
                             super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                             ._M_storage._M_storage + 0x10);
    if (lVar2 < lVar1 * -1000000000 + lVar3) {
      gm_time(&local_68,lVar2 / 1000000000);
      sVar4 = strftime(buffer._M_elems,100,"%FT%TZ",(tm *)&local_68);
      if (sVar4 == 0) {
        memcpy(&buffer,"(unknown)",99);
      }
      buffer._M_elems[99] = '\0';
      log<char*>(info,"Deleted old partial message. Arrived ",buffer._M_elems);
      __it._M_cur = (__node_type *)
                    std::
                    _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::erase(&(this->cmds_)._M_h,__it._M_cur);
    }
    else {
      __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->cmds_mut_);
  return;
}

Assistant:

void command_processor::scavenge () {
            pstore::log (priority::info, "Scavenging zombie commands");

            // After this function is complete, no partial messages older than 'earliest time' will
            // be in the partial command map (cmds_).
            auto const earliest_time = std::chrono::system_clock::now () - delete_threshold_;

            // Remove all partial messages where the last piece of the message arrived before
            // earliest_time. It's most likely that the sending process gave up/crashed/lost
            // interest before sending the complete message.
            std::lock_guard<decltype (cmds_mut_)> const lock{cmds_mut_};
            auto const end = std::end (cmds_);
            auto it = std::begin (cmds_);
            while (it != end) {
                auto const arrival_time = it->second.arrive_time_;
                if (arrival_time < earliest_time) {
                    std::array<char, 100> buffer;
                    pstore::log (priority::info, "Deleted old partial message. Arrived ",
                                 time_to_string (arrival_time, &buffer));
                    it = cmds_.erase (it);
                } else {
                    ++it;
                }
            }
        }